

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceContainer.cpp
# Opt level: O0

bool __thiscall IceCore::Container::DeleteKeepingOrder(Container *this,udword entry)

{
  uint local_24;
  uint local_20;
  udword j;
  udword i;
  udword entry_local;
  Container *this_local;
  
  local_20 = 0;
  while( true ) {
    if (this->mCurNbEntries <= local_20) {
      return false;
    }
    if (this->mEntries[local_20] == entry) break;
    local_20 = local_20 + 1;
  }
  this->mCurNbEntries = this->mCurNbEntries - 1;
  for (local_24 = local_20; local_24 < this->mCurNbEntries; local_24 = local_24 + 1) {
    this->mEntries[local_24] = this->mEntries[local_24 + 1];
  }
  return true;
}

Assistant:

bool Container::DeleteKeepingOrder(udword entry)
{
	// Look for the entry
	for(udword i=0;i<mCurNbEntries;i++)
	{
		if(mEntries[i]==entry)
		{
			// Entry has been found at index i.
			// Shift entries to preserve order. You really should use a linked list instead.
			mCurNbEntries--;
			for(udword j=i;j<mCurNbEntries;j++)
			{
				mEntries[j] = mEntries[j+1];
			}
			return true;
		}
	}
	return false;
}